

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O1

shared_ptr<pbrt::syntactic::Texture> __thiscall
pbrt::syntactic::Attributes::findNamedTexture(Attributes *this,string *name)

{
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<pbrt::syntactic::Texture> sVar2;
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  long local_28 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_48._0_8_ = (pointer)0x0;
  local_48._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38._M_allocated_capacity = (size_type)local_28;
  std::__cxx11::string::_M_construct<char*>((string *)(local_48 + 0x10),*in_RDX,in_RDX[1] + *in_RDX)
  ;
  sVar2 = findNamedItem<std::shared_ptr<pbrt::syntactic::Texture>>
                    (this,(shared_ptr<pbrt::syntactic::Texture> *)name,(string *)local_48);
  _Var1 = sVar2.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi;
  if ((long *)local_38._M_allocated_capacity != local_28) {
    operator_delete((void *)local_38._M_allocated_capacity,local_28[0] + 1);
    _Var1._M_pi = extraout_RDX;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pbrt::syntactic::Texture>)
         sVar2.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Texture> findNamedTexture(std::string name) {
        return findNamedItem(std::shared_ptr<Texture>{}, name);
      }